

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandTopAnd(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  Abc_Obj_t *pAVar3;
  char *pcVar4;
  
  pAVar2 = Abc_FrameReadNtk(pAbc);
  Extra_UtilGetoptReset();
  iVar1 = Extra_UtilGetopt(argc,argv,"h");
  if (iVar1 == -1) {
    if (pAVar2 == (Abc_Ntk_t *)0x0) {
      pcVar4 = "Empty network.\n";
    }
    else {
      if (pAVar2->ntkType != ABC_NTK_STRASH) {
        pcVar4 = "Currently only works for structurally hashed circuits.\n";
LAB_0022b0de:
        Abc_Print(-1,pcVar4);
        return 0;
      }
      if (0 < pAVar2->nObjCounts[8]) {
        pcVar4 = "Currently can only works for combinational circuits.\n";
        goto LAB_0022b0de;
      }
      if (pAVar2->vPos->nSize != 1) {
        pcVar4 = "Currently expects a single-output miter.\n";
        goto LAB_0022b0de;
      }
      pAVar3 = Abc_NtkPo(pAVar2,0);
      if ((pAVar3->field_0x15 & 4) != 0) {
        pcVar4 = "The PO driver is complemented. AND-decomposition is impossible.\n";
        goto LAB_0022b0de;
      }
      pAVar3 = Abc_NtkPo(pAVar2,0);
      pAVar3 = Abc_ObjChild0(pAVar3);
      if ((*(uint *)&pAVar3->field_0x14 & 0xf) != 7) {
        pcVar4 = "The PO driver is not a node. AND-decomposition is impossible.\n";
        goto LAB_0022b0de;
      }
      pAVar2 = Abc_NtkTopAnd(pAVar2);
      if (pAVar2 != (Abc_Ntk_t *)0x0) {
        Abc_FrameReplaceCurrentNetwork(pAbc,pAVar2);
        return 0;
      }
      pcVar4 = "The command has failed.\n";
    }
    iVar1 = -1;
  }
  else {
    iVar1 = -2;
    Abc_Print(-2,"usage: topand [-h]\n");
    Abc_Print(-2,"\t         performs AND-decomposition of single-output combinational miter\n");
    Abc_Print(-2,"\t-h     : print the command usage\n");
    pcVar4 = "\tname   : the node name\n";
  }
  Abc_Print(iVar1,pcVar4);
  return 1;
}

Assistant:

int Abc_CommandTopAnd( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    int c;
    extern Abc_Ntk_t * Abc_NtkTopAnd( Abc_Ntk_t * pNtk );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "h" ) ) != EOF )
    {
        switch ( c )
        {
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "Currently only works for structurally hashed circuits.\n" );
        return 0;
    }

    if ( Abc_NtkLatchNum(pNtk) > 0 )
    {
        Abc_Print( -1, "Currently can only works for combinational circuits.\n" );
        return 0;
    }
    if ( Abc_NtkPoNum(pNtk) != 1 )
    {
        Abc_Print( -1, "Currently expects a single-output miter.\n" );
        return 0;
    }
    if ( Abc_ObjFaninC0(Abc_NtkPo(pNtk, 0)) )
    {
        Abc_Print( -1, "The PO driver is complemented. AND-decomposition is impossible.\n" );
        return 0;
    }
    if ( !Abc_ObjIsNode(Abc_ObjChild0(Abc_NtkPo(pNtk, 0))) )
    {
        Abc_Print( -1, "The PO driver is not a node. AND-decomposition is impossible.\n" );
        return 0;
    }
    pNtkRes = Abc_NtkTopAnd( pNtk );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "The command has failed.\n" );
        return 1;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: topand [-h]\n" );
    Abc_Print( -2, "\t         performs AND-decomposition of single-output combinational miter\n" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\tname   : the node name\n");
    return 1;
}